

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  MessageOptions *pMVar5;
  Type *proto_00;
  Type *proto_01;
  Type *pTVar6;
  ulong uVar7;
  long *plVar8;
  long *plVar9;
  Type *descriptor;
  void *pvVar10;
  OneofOptions *pOVar11;
  size_type *psVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  DescriptorBuilder *this_02;
  long lVar16;
  RepeatedPtrFieldBase *this_03;
  long *local_280 [2];
  long local_270 [2];
  DescriptorBuilder *local_260;
  string local_258;
  SubstituteArg local_238;
  string local_208;
  RepeatedPtrFieldBase *local_1d8;
  string local_1d0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (*(long *)(message + 0x20) == 0) {
    pMVar5 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar5;
  }
  if (0 < *(int *)(message + 0x48)) {
    this_00 = &proto->nested_type_;
    lVar13 = 0;
    lVar16 = 0;
    do {
      lVar15 = *(long *)(message + 0x50);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,(int)lVar16);
      CrossLinkMessage(this,(Descriptor *)(lVar15 + lVar13),proto_00);
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 0xa8;
    } while (lVar16 < *(int *)(message + 0x48));
  }
  if (0 < *(int *)(message + 0x58)) {
    this_01 = &proto->enum_type_;
    lVar13 = 0;
    lVar16 = 0;
    do {
      lVar15 = *(long *)(message + 0x60);
      this_02 = (DescriptorBuilder *)this_01;
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&this_01->super_RepeatedPtrFieldBase,(int)lVar16);
      CrossLinkEnum(this_02,(EnumDescriptor *)(lVar15 + lVar13),proto_01);
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 0x38;
    } while (lVar16 < *(int *)(message + 0x58));
  }
  uVar7 = (ulong)*(uint *)(message + 0x2c);
  if (0 < (int)*(uint *)(message + 0x2c)) {
    pRVar1 = &proto->field_;
    lVar13 = 0;
    lVar16 = 0;
    do {
      lVar15 = *(long *)(message + 0x30);
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,(int)lVar16);
      CrossLinkField(this,(FieldDescriptor *)(lVar15 + lVar13),pTVar6);
      lVar16 = lVar16 + 1;
      uVar7 = (ulong)*(int *)(message + 0x2c);
      lVar13 = lVar13 + 0xa8;
    } while (lVar16 < (long)uVar7);
  }
  if (0 < *(int *)(message + 0x78)) {
    pRVar1 = &proto->extension_;
    lVar13 = 0;
    lVar16 = 0;
    do {
      lVar15 = *(long *)(message + 0x80);
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,(int)lVar16);
      CrossLinkField(this,(FieldDescriptor *)(lVar15 + lVar13),pTVar6);
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 0xa8;
    } while (lVar16 < *(int *)(message + 0x78));
    uVar7 = (ulong)*(uint *)(message + 0x2c);
  }
  uVar4 = (uint)uVar7;
  if (0 < (int)uVar4) {
    local_1d8 = &(proto->field_).super_RepeatedPtrFieldBase;
    lVar13 = -0xa8;
    lVar16 = 0;
    local_260 = this;
    do {
      plVar9 = *(long **)(*(long *)(message + 0x30) + 0x108 + lVar13);
      if (plVar9 != (long *)0x0) {
        if ((0 < *(int *)((long)plVar9 + 0x1c)) &&
           (*(long **)(*(long *)(message + 0x30) + 0x60 + lVar13) != plVar9)) {
          local_280[0] = local_270;
          lVar15 = **(long **)(message + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_280,lVar15,(*(long **)(message + 8))[1] + lVar15);
          std::__cxx11::string::append((char *)local_280);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_280,
                                      **(ulong **)(*(long *)(message + 0x30) + lVar13));
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          psVar12 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_258.field_2._M_allocated_capacity = *psVar12;
            local_258.field_2._8_8_ = plVar8[3];
          }
          else {
            local_258.field_2._M_allocated_capacity = *psVar12;
            local_258._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_258._M_string_length = plVar8[1];
          *plVar8 = (long)psVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          pTVar6 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                             (local_1d8,(int)lVar16 + -1);
          local_208._M_dataplus._M_p =
               (pointer)**(undefined8 **)(*(long *)(message + 0x30) + lVar13);
          local_208._M_string_length =
               CONCAT44(local_208._M_string_length._4_4_,
                        *(undefined4 *)(*(undefined8 **)(*(long *)(message + 0x30) + lVar13) + 1));
          local_238.text_ = *(char **)*plVar9;
          local_238.size_ = *(int *)((undefined8 *)*plVar9 + 1);
          local_60.text_ = (char *)0x0;
          local_60.size_ = -1;
          local_90.text_ = (char *)0x0;
          local_90.size_ = -1;
          local_c0.text_ = (char *)0x0;
          local_c0.size_ = -1;
          local_f0.text_ = (char *)0x0;
          local_f0.size_ = -1;
          local_120.text_ = (char *)0x0;
          local_120.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_1b0.text_ = (char *)0x0;
          local_1b0.size_ = -1;
          strings::Substitute_abi_cxx11_
                    (&local_1d0,
                     (strings *)
                     "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
                     ,(char *)&local_208,&local_238,&local_60,&local_90,&local_c0,&local_f0,
                     &local_120,&local_150,&local_180,&local_1b0,(SubstituteArg *)proto);
          AddError(local_260,&local_258,&pTVar6->super_Message,OTHER,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          this = local_260;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if (local_280[0] != local_270) {
            operator_delete(local_280[0],local_270[0] + 1);
          }
          uVar7 = (ulong)*(uint *)(message + 0x2c);
        }
        piVar2 = (int *)(*(long *)(message + 0x40) + 0x1c +
                        (long)((int)((ulong)((long)plVar9 - *(long *)(plVar9[2] + 0x40)) >> 4) *
                              -0x55555555) * 0x30);
        *piVar2 = *piVar2 + 1;
      }
      lVar16 = lVar16 + 1;
      uVar4 = (uint)uVar7;
      lVar13 = lVar13 + 0xa8;
    } while (lVar16 < (int)uVar4);
  }
  if (0 < *(int *)(message + 0x38)) {
    this_03 = &(proto->oneof_decl_).super_RepeatedPtrFieldBase;
    lVar16 = 0x28;
    lVar13 = 0;
    do {
      lVar15 = *(long *)(message + 0x40);
      iVar14 = *(int *)(lVar15 + -0xc + lVar16);
      if (iVar14 == 0) {
        local_238.text_ = local_238.scratch_ + 4;
        lVar3 = **(long **)(message + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,lVar3,(*(long **)(message + 8))[1] + lVar3);
        std::__cxx11::string::append((char *)&local_238);
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_238,**(ulong **)(lVar15 + -0x28 + lVar16));
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_208.field_2._M_allocated_capacity = *psVar12;
          local_208.field_2._8_8_ = plVar9[3];
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar12;
          local_208._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_208._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        descriptor = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                               (this_03,(int)lVar13);
        AddError(this,&local_208,&descriptor->super_Message,NAME,
                 "Oneof must have at least one field.");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if (local_238.text_ != local_238.scratch_ + 4) {
          operator_delete(local_238.text_,local_238.scratch_._4_8_ + 1);
        }
        iVar14 = *(int *)(lVar15 + -0xc + lVar16);
      }
      pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar14 << 3);
      *(void **)(lVar15 + -8 + lVar16) = pvVar10;
      *(undefined4 *)(lVar15 + -0xc + lVar16) = 0;
      if (*(long *)(lVar15 + lVar16) == 0) {
        pOVar11 = OneofOptions::default_instance();
        *(OneofOptions **)(lVar15 + lVar16) = pOVar11;
      }
      lVar13 = lVar13 + 1;
      lVar16 = lVar16 + 0x30;
    } while (lVar13 < *(int *)(message + 0x38));
    uVar4 = *(uint *)(message + 0x2c);
  }
  if (0 < (int)uVar4) {
    lVar13 = 0;
    do {
      lVar16 = *(long *)(message + 0x30);
      lVar15 = *(long *)(lVar16 + 0x60 + lVar13);
      if (lVar15 != 0) {
        lVar3 = *(long *)(message + 0x40);
        lVar15 = (long)((int)((ulong)(lVar15 - *(long *)(*(long *)(lVar15 + 0x10) + 0x40)) >> 4) *
                       -0x55555555) * 0x30;
        iVar14 = *(int *)(lVar3 + 0x1c + lVar15);
        *(int *)(lVar16 + 0x54 + lVar13) = iVar14;
        *(int *)(lVar3 + 0x1c + lVar15) = iVar14 + 1;
        *(long *)(*(long *)(lVar3 + 0x20 + lVar15) + (long)iVar14 * 8) = lVar16 + lVar13;
      }
      lVar13 = lVar13 + 0xa8;
    } while ((ulong)uVar4 * 0xa8 - lVar13 != 0);
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(
    Descriptor* message, const DescriptorProto& proto) {
  if (message->options_ == NULL) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != NULL) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(
            message->full_name() + "." + message->field(i - 1)->name(),
            proto.field(i - 1), DescriptorPool::ErrorCollector::OTHER,
            strings::Substitute(
                "Fields in the same oneof must be defined consecutively. "
                "\"$0\" cannot be defined before the completion of the "
                "\"$1\" oneof definition.",
                message->field(i - 1)->name(), oneof_decl->name()));
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      ++message->oneof_decls_[oneof_decl->index()].field_count_;
    }
  }

  // Then allocate the arrays.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(message->full_name() + "." + oneof_decl->name(),
               proto.oneof_decl(i),
               DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }

    oneof_decl->fields_ =
      tables_->AllocateArray<const FieldDescriptor*>(oneof_decl->field_count_);
    oneof_decl->field_count_ = 0;

    if (oneof_decl->options_ == NULL) {
      oneof_decl->options_ = &OneofOptions::default_instance();
    }
  }

  // Then fill them in.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != NULL) {
      OneofDescriptor* mutable_oneof_decl =
          &message->oneof_decls_[oneof_decl->index()];
      message->fields_[i].index_in_oneof_ = mutable_oneof_decl->field_count_;
      mutable_oneof_decl->fields_[mutable_oneof_decl->field_count_++] =
          message->field(i);
    }
  }
}